

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTests.cpp
# Opt level: O0

void checkTimeLiteral(string *s,TimeUnit flagCheck,double num)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  bool bVar1;
  ExprLhs<slang::parsing::TokenKind_&> this;
  AssertionHandler *this_00;
  LanguageVersion in_stack_00000024;
  string_view in_stack_00000028;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  Token token;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 uVar2;
  OfType in_stack_fffffffffffffb5c;
  AssertionHandler *in_stack_fffffffffffffb60;
  SourceManager *in_stack_fffffffffffffb68;
  Diagnostics *in_stack_fffffffffffffb70;
  SourceLineInfo *pSVar3;
  char *in_stack_fffffffffffffb78;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  size_type sVar5;
  ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffb88;
  Flags in_stack_fffffffffffffb90;
  Flags resultDisposition;
  undefined1 local_418 [32];
  char *local_3f8;
  size_type sStack_3f0;
  StringRef local_3c8;
  SourceLineInfo local_3b0;
  StringRef local_3a0;
  double local_340;
  StringRef local_308;
  SourceLineInfo local_2f8;
  StringRef local_2e8;
  NumericTokenFlags local_28b;
  TimeUnit local_28a;
  TimeUnit *local_288;
  StringRef local_250;
  SourceLineInfo local_240;
  StringRef local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  StringRef local_178;
  SourceLineInfo local_168;
  StringRef local_158;
  undefined2 local_fe;
  TokenKind *local_e8;
  StringRef local_b0;
  SourceLineInfo local_a0;
  StringRef local_90;
  __sv_type local_38;
  Token local_28 [2];
  
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffb60);
  local_28[0] = lexToken(in_stack_00000028,in_stack_00000024);
  local_90 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffb60,
                        CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x2cc);
  local_b0 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffb60,
                        CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  uVar2 = 2;
  macroName.m_size = (size_type)in_stack_fffffffffffffb80;
  macroName.m_start = in_stack_fffffffffffffb78;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffb70;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffb68;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb60,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb5c,2),capturedExpression,
             in_stack_fffffffffffffb90);
  this = Catch::operator<=<slang::parsing::TokenKind_&,_0>
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffb5c,uVar2),(TokenKind *)0x5d5796);
  local_fe = 9;
  local_e8 = this.m_lhs;
  Catch::operator==((ExprLhs<slang::parsing::TokenKind_&> *)in_stack_fffffffffffffb88,
                    (TokenKind *)in_stack_fffffffffffffb80);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb60,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb5c,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb60);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb60);
  local_158 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb60,CONCAT44(in_stack_fffffffffffffb5c,uVar2)
                        );
  Catch::SourceLineInfo::SourceLineInfo
            (&local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x2cd);
  local_178 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb60,CONCAT44(in_stack_fffffffffffffb5c,uVar2)
                        );
  uVar2 = 2;
  macroName_00.m_size = (size_type)in_stack_fffffffffffffb80;
  macroName_00.m_start = in_stack_fffffffffffffb78;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffb70;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffffb68;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb60,macroName_00,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb5c,2),capturedExpression_00,
             in_stack_fffffffffffffb90);
  slang::parsing::Token::toString_abi_cxx11_((Token *)this.m_lhs);
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Catch::
              operator<=<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffb5c,uVar2),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5d5910);
  Catch::operator==(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb60,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb5c,uVar2));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb60);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb60);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb60);
  local_230 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb60,CONCAT44(in_stack_fffffffffffffb5c,uVar2)
                        );
  Catch::SourceLineInfo::SourceLineInfo
            (&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x2ce);
  local_250 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb60,CONCAT44(in_stack_fffffffffffffb5c,uVar2)
                        );
  uVar2 = 2;
  macroName_01.m_size = (size_type)in_stack_fffffffffffffb80;
  macroName_01.m_start = in_stack_fffffffffffffb78;
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffffb70;
  capturedExpression_01.m_start = (char *)in_stack_fffffffffffffb68;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb60,macroName_01,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb5c,2),capturedExpression_01,
             in_stack_fffffffffffffb90);
  local_28b = slang::parsing::Token::numericFlags(local_28);
  local_28a = slang::parsing::NumericTokenFlags::unit(&local_28b);
  local_288 = (TimeUnit *)
              Catch::operator<=<slang::TimeUnit,_0>
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffb5c,uVar2),
                         (TimeUnit *)0x5d5b17);
  Catch::operator==((ExprLhs<const_slang::TimeUnit_&> *)in_stack_fffffffffffffb88,
                    (TimeUnit *)in_stack_fffffffffffffb80);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb60,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb5c,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb60);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb60);
  local_2e8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb60,CONCAT44(in_stack_fffffffffffffb5c,uVar2)
                        );
  pSVar3 = &local_2f8;
  Catch::SourceLineInfo::SourceLineInfo
            (pSVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
             ,0x2cf);
  resultDisposition = (Flags)pSVar3;
  local_308 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb60,CONCAT44(in_stack_fffffffffffffb5c,uVar2)
                        );
  uVar2 = 2;
  macroName_02.m_size = (size_type)in_stack_fffffffffffffb80;
  macroName_02.m_start = in_stack_fffffffffffffb78;
  capturedExpression_02.m_size = (size_type)in_stack_fffffffffffffb70;
  capturedExpression_02.m_start = (char *)in_stack_fffffffffffffb68;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb60,macroName_02,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb5c,2),capturedExpression_02,
             resultDisposition);
  slang::parsing::Token::realValue((Token *)in_stack_fffffffffffffb60);
  local_340 = (double)Catch::operator<=<double,_0>
                                ((Decomposer *)CONCAT44(in_stack_fffffffffffffb5c,uVar2),
                                 3.02298709625038e-317);
  Catch::operator==((ExprLhs<double> *)local_340,(double)in_stack_fffffffffffffb80);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb60,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb5c,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb60);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb60);
  getSourceManager();
  slang::Diagnostics::sort(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  bVar1 = slang::SmallVectorBase<slang::Diagnostic>::empty
                    ((SmallVectorBase<slang::Diagnostic> *)slang::diagnostics);
  if (!bVar1) {
    local_3a0 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffb60,
                           CONCAT44(in_stack_fffffffffffffb5c,uVar2));
    pSVar3 = &local_3b0;
    Catch::SourceLineInfo::SourceLineInfo
              (pSVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/LexerTests.cpp"
               ,0x2d0);
    pcVar4 = (char *)0x0;
    sVar5 = 0;
    local_3c8.m_start = (char *)0x0;
    local_3c8.m_size = 0;
    Catch::StringRef::StringRef(&local_3c8);
    uVar2 = 2;
    macroName_03.m_size = sVar5;
    macroName_03.m_start = pcVar4;
    capturedExpression_03.m_size = (size_type)pSVar3;
    capturedExpression_03.m_start = (char *)in_stack_fffffffffffffb68;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffffb60,macroName_03,
               (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb5c,2),capturedExpression_03,
               resultDisposition);
    local_3f8 = pcVar4;
    sStack_3f0 = sVar5;
    Catch::MessageStream::MessageStream((MessageStream *)0x5d5e89);
    reportGlobalDiags_abi_cxx11_();
    Catch::operator+(local_418);
    this_00 = (AssertionHandler *)
              Catch::MessageStream::operator<<
                        ((MessageStream *)in_stack_fffffffffffffb60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb5c,uVar2));
    Catch::ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffb5c,uVar2));
    Catch::AssertionHandler::handleMessage(this_00,in_stack_fffffffffffffb5c,(string *)0x5d5ef5);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    Catch::MessageStream::~MessageStream((MessageStream *)0x5d5f1e);
    Catch::AssertionHandler::complete(this_00);
    Catch::AssertionHandler::~AssertionHandler(this_00);
  }
  return;
}

Assistant:

void checkTimeLiteral(const std::string& s, TimeUnit flagCheck, double num) {
    Token token = lexToken(s);

    CHECK(token.kind == TokenKind::TimeLiteral);
    CHECK(token.toString() == s);
    CHECK(token.numericFlags().unit() == flagCheck);
    CHECK(token.realValue() == num);
    CHECK_DIAGNOSTICS_EMPTY;
}